

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O2

void __thiscall
jrtplib::RTPFakeTransmitter::DeleteTransmissionInfo
          (RTPFakeTransmitter *this,RTPTransmissionInfo *inf)

{
  if (this->init == true) {
    RTPDelete<jrtplib::RTPTransmissionInfo>
              (inf,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr);
    return;
  }
  return;
}

Assistant:

void RTPFakeTransmitter::DeleteTransmissionInfo(RTPTransmissionInfo *inf)
{
	if (!init)
		return;
	RTPDelete(inf,GetMemoryManager());
}